

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retrieval.cpp
# Opt level: O0

void batch_decode(llama_context *ctx,llama_batch *batch,float *output,int n_seq,int n_embd)

{
  undefined8 uVar1;
  int iVar2;
  common_log *pcVar3;
  long lVar4;
  uint in_ECX;
  uint *in_RSI;
  undefined8 in_RDI;
  float *out;
  float *embd;
  int i;
  int embd_norm;
  int n;
  float *out_00;
  float *in_stack_ffffffffffffff80;
  uint local_5c;
  undefined1 local_58 [40];
  int iStack_30;
  int iStack_2c;
  float *local_28;
  uint local_1c;
  uint *local_10;
  undefined8 local_8;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  llama_kv_self_clear(in_RDI);
  if (-1 < common_log_verbosity_thold) {
    pcVar3 = common_log_main();
    common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"%s: n_tokens = %d, n_seq = %d\n","batch_decode",
                   (ulong)*local_10,(ulong)local_1c);
  }
  uVar1 = local_8;
  memcpy(local_58,local_10,0x38);
  iVar2 = llama_decode(uVar1);
  embd_norm = iStack_30;
  n = iStack_2c;
  out_00 = local_28;
  if ((iVar2 < 0) && (-1 < common_log_verbosity_thold)) {
    pcVar3 = common_log_main();
    common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"%s : failed to decode\n","batch_decode");
    embd_norm = iStack_30;
    n = iStack_2c;
    out_00 = local_28;
  }
  for (local_5c = 0; (int)local_5c < (int)*local_10; local_5c = local_5c + 1) {
    if (*(char *)(*(long *)(local_10 + 0xc) + (long)(int)local_5c) != '\0') {
      lVar4 = llama_get_embeddings_seq
                        (local_8,**(undefined4 **)
                                   (*(long *)(local_10 + 10) + (long)(int)local_5c * 8));
      if ((lVar4 == 0) && (lVar4 = llama_get_embeddings_ith(local_8,local_5c), lVar4 == 0)) {
        if (-1 < common_log_verbosity_thold) {
          pcVar3 = common_log_main();
          common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"%s: failed to get embeddings for token %d\n",
                         "batch_decode",(ulong)local_5c);
        }
      }
      else {
        common_embd_normalize(in_stack_ffffffffffffff80,out_00,n,embd_norm);
      }
    }
  }
  return;
}

Assistant:

static void batch_decode(llama_context * ctx, llama_batch & batch, float * output, int n_seq, int n_embd) {
    // clear previous kv_cache values (irrelevant for embeddings)
    llama_kv_self_clear(ctx);

    // run model
    LOG_INF("%s: n_tokens = %d, n_seq = %d\n", __func__, batch.n_tokens, n_seq);
    if (llama_decode(ctx, batch) < 0) {
        LOG_ERR("%s : failed to decode\n", __func__);
    }

    for (int i = 0; i < batch.n_tokens; i++) {
        if (!batch.logits[i]) {
            continue;
        }

        // try to get sequence embeddings - supported only when pooling_type is not NONE
        const float * embd = llama_get_embeddings_seq(ctx, batch.seq_id[i][0]);
        if (embd == NULL) {
            embd = llama_get_embeddings_ith(ctx, i);
            if (embd == NULL) {
                LOG_ERR("%s: failed to get embeddings for token %d\n", __func__, i);
                continue;
            }
        }

        float * out = output + batch.seq_id[i][0] * n_embd;
        common_embd_normalize(embd, out, n_embd, 2);
    }
}